

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model-base-ekf-flex-estimator-imu.cpp
# Opt level: O1

void __thiscall
stateObservation::flexibilityEstimation::ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices
          (ModelBaseEKFFlexEstimatorIMU *this)

{
  Matrix *pMVar1;
  long lVar2;
  DenseStorage<double,__1,__1,__1,_0> *pDVar3;
  bool bVar4;
  undefined4 uVar5;
  double dVar6;
  int iVar7;
  Index col;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar9;
  Index inner;
  long lVar10;
  char *__function;
  long lVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  Matrix m;
  SrcEvaluatorType srcEvaluator;
  Matrix6 R;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_219;
  DenseStorage<double,__1,__1,__1,_0> local_218;
  Matrix *local_1f8;
  double *local_1f0;
  long local_1e8;
  ulong local_1e0;
  Matrix *local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  undefined1 local_1b8 [48];
  undefined1 local_188 [12];
  undefined4 uStack_17c;
  DenseStorage<double,__1,__1,__1,_0> *pDStack_178;
  ulong local_168;
  double local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  DstEvaluatorType local_68;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,__1,_0,_6,__1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>
  local_50;
  double *pdVar8;
  
  iVar7 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])();
  pdVar8 = (double *)CONCAT44(extraout_var,iVar7);
  iVar7 = (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
            _vptr_FlexibilityEstimatorBase[0x14])(this);
  register0x00000000 = CONCAT44(extraout_var_00,iVar7);
  local_188._0_8_ = pdVar8;
  if (-1 < (long)(register0x00000000 | (ulong)pdVar8)) {
    Eigen::internal::
    call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
              (&this->R_,
               (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                *)local_188,(assign_op<double,_double> *)&local_1f0);
    local_188._0_8_ = 0x3eb0c6f7a0b5ed8d;
    local_158 = 0;
    stack0xfffffffffffffe80 = 0;
    pDStack_178 = (DenseStorage<double,__1,__1,__1,_0> *)0x0;
    local_150 = 0x3eb0c6f7a0b5ed8d;
    local_148 = 0;
    local_128 = 0;
    uStack_120 = 0;
    local_118 = 0x3eb0c6f7a0b5ed8d;
    local_e0 = 0x3eb0c6f7a0b5ed8d;
    local_b0 = 0;
    local_d8 = 0;
    uStack_d0 = 0;
    local_a8 = 0x3eb0c6f7a0b5ed8d;
    local_a0 = 0;
    local_80 = 0;
    uStack_78 = 0;
    local_70 = 0x3eb0c6f7a0b5ed8d;
    lVar2 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_rows;
    if ((lVar2 < 6) ||
       ((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
        < 6)) {
      __assert_fail("startRow >= 0 && BlockRows >= 0 && startRow + BlockRows <= xpr.rows() && startCol >= 0 && BlockCols >= 0 && startCol + BlockCols <= xpr.cols()"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x85,
                    "Eigen::Block<Eigen::Matrix<double, -1, -1>, 6, 6>::Block(XprType &, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = 6, BlockCols = 6, InnerPanel = false]"
                   );
    }
    pdVar8 = (this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + 4;
    lVar11 = 0x20;
    do {
      dVar6 = *(double *)(local_188 + lVar11 + -0x18);
      pdVar8[-4] = *(double *)(local_188 + lVar11 + -0x20);
      pdVar8[-3] = dVar6;
      dVar6 = *(double *)(local_188 + lVar11 + -8);
      pdVar8[-2] = *(double *)(local_188 + lVar11 + -0x10);
      pdVar8[-1] = dVar6;
      uVar15 = *(undefined4 *)(local_188 + lVar11 + 4);
      uVar16 = *(undefined4 *)(local_188 + lVar11 + 8);
      uVar5 = *(undefined4 *)((long)&uStack_17c + lVar11);
      *(undefined4 *)pdVar8 = *(undefined4 *)(local_188 + lVar11);
      *(undefined4 *)((long)pdVar8 + 4) = uVar15;
      *(undefined4 *)(pdVar8 + 1) = uVar16;
      *(undefined4 *)((long)pdVar8 + 0xc) = uVar5;
      lVar11 = lVar11 + 0x30;
      pdVar8 = pdVar8 + lVar2;
    } while (lVar11 != 0x140);
    (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
      _vptr_FlexibilityEstimatorBase[0x44])(this);
    local_218.m_data = (double *)0x0;
    local_218.m_rows = 0;
    local_218.m_cols = 0;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_218,0x24,6,6);
    local_188._0_8_ = local_218.m_rows;
    stack0xfffffffffffffe80 = local_218.m_cols;
    if (-1 < (local_218.m_cols | local_218.m_rows)) {
      Eigen::internal::
      call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
                ((Matrix<double,__1,__1,_0,__1,__1> *)&local_218,
                 (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                  *)local_188,(assign_op<double,_double> *)&local_1f0);
      getDefaultQ();
      pMVar1 = &this->Q_;
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (double *)local_188._0_8_;
      uVar14 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_rows;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
           stack0xfffffffffffffe80;
      pDVar3 = (DenseStorage<double,__1,__1,__1,_0> *)
               (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_cols;
      (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
           (Index)pDStack_178;
      local_188._0_8_ = pdVar8;
      unique0x10001142 = uVar14;
      pDStack_178 = pDVar3;
      free(pdVar8);
      local_1f8 = pMVar1;
      if (this->withUnmodeledForces_ == true) {
        if ((double *)local_218.m_rows != (double *)0x6) {
          __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                        ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,
                        "Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, 6, 6>>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, 6, 6>>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
                       );
        }
        if (local_218.m_cols < 0) {
          __function = 
          "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, 6, -1, 0, 6, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, 6, -1, 0, 6, -1>]"
          ;
          goto LAB_0014e0ce;
        }
        local_168 = local_218.m_cols;
        local_160 = 0.01;
        local_1c0 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_rows;
        local_1f0 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                    m_storage.m_data + local_1c0 * 0x18 + 0x18;
        local_1e8 = 6;
        local_1e0 = 6;
        local_1d0 = 0x18;
        local_1c8 = 0x18;
        local_1d8 = pMVar1;
        pDStack_178 = &local_218;
        if ((local_1c0 < 0x1e) ||
           ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0x1e)) goto LAB_0014e09a;
        Eigen::internal::
        product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        ::product_evaluator((product_evaluator<Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                             *)(local_1b8 + 8),(XprType *)(local_188 + 8));
        local_1b8._32_8_ = local_160;
        if ((local_1e8 != 6) || (local_1e0 != local_168)) {
          __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                        "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1>>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1>>]"
                       );
        }
        local_50.m_dst = &local_68;
        local_68.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_data = local_1f0;
        local_68.
        super_block_evaluator<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
        super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
        .m_outerStride.m_value =
             (local_1d8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
             .m_rows;
        local_50.m_src = (SrcEvaluatorType *)local_1b8;
        local_50.m_functor = &local_219;
        local_50.m_dstExpr = (DstXprType *)&local_1f0;
        Eigen::internal::
        dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Product<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_6,_6,_0,_6,_6>_>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_6,_-1,_0,_6,_-1>_>_>_>,_Eigen::internal::assign_op<double,_double>,_0>,_4,_0>
        ::run(&local_50);
        free((void *)local_1b8._16_8_);
      }
      else {
        lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_rows;
        if ((lVar2 < 0x1e) ||
           ((this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols < 0x1e)) goto LAB_0014e09a;
        pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data + lVar2 * 0x18 + 0x18;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar14 = (ulong)pdVar8 >> 3;
          lVar11 = 6;
          do {
            if ((uVar14 & 1) != 0) {
              *pdVar8 = 0.0;
            }
            uVar13 = (uint)uVar14 & 1;
            uVar14 = (ulong)uVar13;
            uVar9 = (ulong)(6 - uVar13 & 0xfffffffe | uVar13);
            if (uVar9 <= uVar14 + 2) {
              uVar9 = uVar14 + 2;
            }
            memset(pdVar8 + uVar14,0,(~uVar14 + uVar9 & 0xffffffffffffffe) * 8 + 0x10);
            if (uVar14 != 0) {
              pdVar8[5] = 0.0;
            }
            uVar14 = uVar14 + lVar2;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        else {
          lVar11 = 6;
          do {
            pdVar8[4] = 0.0;
            pdVar8[5] = 0.0;
            pdVar8[2] = 0.0;
            pdVar8[3] = 0.0;
            *pdVar8 = 0.0;
            pdVar8[1] = 0.0;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data + lVar2 * 0x1e + 0x1e;
      bVar4 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 0x20 || lVar2 < 0x20;
      if (this->withComBias_ == true) {
        if (bVar4) goto LAB_0014e09a;
        lVar11 = 0;
        do {
          lVar10 = 0;
          do {
            uVar15 = 0xe826d695;
            uVar16 = 0x3df12e0b;
            if (lVar11 != lVar10) {
              uVar15 = 0;
              uVar16 = 0;
            }
            pdVar8[lVar10] = (double)CONCAT44(uVar16,uVar15);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 2);
          lVar11 = lVar11 + 1;
          pdVar8 = pdVar8 + lVar2;
        } while (lVar11 != 2);
      }
      else {
        if (bVar4) goto LAB_0014e09a;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar14 = (ulong)pdVar8 >> 3;
          lVar11 = 2;
          do {
            if ((uVar14 & 1) != 0) {
              *pdVar8 = 0.0;
            }
            uVar12 = (uint)uVar14 & 1;
            uVar14 = (ulong)uVar12;
            uVar13 = 2 - uVar12 & 0xfffffffe;
            if (uVar13 != 0) {
              uVar13 = uVar13 | uVar12;
              if ((ulong)uVar13 <= uVar14 + 2) {
                uVar13 = (uint)(uVar14 + 2);
              }
              memset(pdVar8 + uVar14,0,(ulong)(uVar13 + ~uVar12 & 2) * 8 + 0x10);
            }
            if (uVar14 != 0) {
              pdVar8[1] = 0.0;
            }
            uVar14 = uVar14 + lVar2;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        else {
          lVar11 = 2;
          do {
            *pdVar8 = 0.0;
            pdVar8[1] = 0.0;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      lVar2 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_rows;
      pdVar8 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
               .m_data + lVar2 * 0x20 + 0x20;
      bVar4 = (this->Q_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
              m_cols < 0x23 || lVar2 < 0x23;
      if (this->withAbsolutePos_ == true) {
        if (bVar4) {
LAB_0014e09a:
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, -1>>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, -1>, BlockRows = -1, BlockCols = -1, InnerPanel = false]"
                       );
        }
        lVar11 = 0;
        do {
          lVar10 = 0;
          do {
            uVar15 = 0xe2308c3a;
            uVar16 = 0x3e45798e;
            if (lVar11 != lVar10) {
              uVar15 = 0;
              uVar16 = 0;
            }
            pdVar8[lVar10] = (double)CONCAT44(uVar16,uVar15);
            lVar10 = lVar10 + 1;
          } while (lVar10 != 3);
          lVar11 = lVar11 + 1;
          pdVar8 = pdVar8 + lVar2;
        } while (lVar11 != 3);
      }
      else {
        if (bVar4) goto LAB_0014e09a;
        if (((ulong)pdVar8 & 7) == 0) {
          uVar14 = (ulong)pdVar8 >> 3;
          lVar11 = 3;
          do {
            if ((uVar14 & 1) != 0) {
              *pdVar8 = 0.0;
            }
            uVar13 = (uint)uVar14 & 1;
            uVar14 = (ulong)uVar13;
            memset(pdVar8 + uVar14,0,(ulong)(uVar13 + 2 + ~uVar13 & 2) * 8 + 0x10);
            if (uVar14 == 0) {
              pdVar8[2] = 0.0;
            }
            uVar14 = uVar14 + lVar2;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        else {
          lVar11 = 3;
          do {
            *pdVar8 = 0.0;
            pdVar8[1] = 0.0;
            pdVar8[2] = 0.0;
            pdVar8 = pdVar8 + lVar2;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
      }
      KalmanFilterBase::setQ
                (&(this->super_EKFFlexibilityEstimatorBase).ekf_.super_KalmanFilterBase,local_1f8);
      (*(this->super_EKFFlexibilityEstimatorBase).super_FlexibilityEstimatorBase.
        _vptr_FlexibilityEstimatorBase[0x3e])(this);
      free(local_218.m_data);
      return;
    }
  }
  __function = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_identity_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
  ;
LAB_0014e0ce:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,__function);
}

Assistant:

void ModelBaseEKFFlexEstimatorIMU::resetCovarianceMatrices()
{

  /////// std::cout << "\n\n\n ============> RESET COVARIANCE MATRIX <=============== \n\n\n" << std::endl;

  R_ = Matrix::Identity(getMeasurementSize(), getMeasurementSize());
  R_.block<6, 6>(0, 0) = getDefaultRIMU();

  updateMeasurementCovarianceMatrix_();
  stateObservation::Matrix m;
  m.resize(6, 6);
  m.setIdentity();

  Q_ = getDefaultQ();

  if(withUnmodeledForces_)
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6) = Matrix6::Identity() * m * 1.e-2;
  else
    Q_.block(state::unmodeledForces, state::unmodeledForces, 6, 6).setZero();

  if(withComBias_)
    Q_.block(state::comBias, state::comBias, 2, 2) = Matrix::Identity(2, 2) * 2.5e-10;
  else
    Q_.block(state::comBias, state::comBias, 2, 2).setZero();

  if(withAbsolutePos_)
    Q_.block(state::drift, state::drift, 3, 3) = Matrix::Identity(3, 3) * 1e-8;
  else
    Q_.block(state::drift, state::drift, 3, 3).setZero();

  ekf_.setQ(Q_);
  resetStateCovarianceMatrix();
}